

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateVPTests.cpp
# Opt level: O1

void __thiscall
vkt::DynamicState::anon_unknown_4::ScissorParamTestInstance::setDynamicStates
          (ScissorParamTestInstance *this)

{
  VkRect2D scissor;
  VkViewport viewport;
  VkRect2D local_38;
  VkViewport local_28;
  
  local_28.x = 0.0;
  local_28.y = 0.0;
  local_28.width = 128.0;
  local_28.height = 128.0;
  local_28.minDepth = 0.0;
  local_28.maxDepth = 0.0;
  local_38.offset.x = 0;
  local_38.offset.y = 0;
  local_38.extent.width = 0x40;
  local_38.extent.height = 0x40;
  DynamicStateBaseClass::setDynamicViewportState
            ((DynamicStateBaseClass *)this,1,&local_28,&local_38);
  DynamicStateBaseClass::setDynamicRasterizationState((DynamicStateBaseClass *)this,1.0,0.0,0.0,0.0)
  ;
  DynamicStateBaseClass::setDynamicBlendState((DynamicStateBaseClass *)this,0.0,0.0,0.0,0.0);
  DynamicStateBaseClass::setDynamicDepthStencilState
            ((DynamicStateBaseClass *)this,-1.0,1.0,0xffffffff,0xffffffff,0,0xffffffff,0xffffffff,0)
  ;
  return;
}

Assistant:

virtual void setDynamicStates (void)
	{
		const vk::VkViewport viewport	= { 0.0f, 0.0f, (float)WIDTH, (float)HEIGHT, 0.0f, 0.0f };
		const vk::VkRect2D scissor		= { { 0, 0 }, { WIDTH / 2, HEIGHT / 2 } };

		setDynamicViewportState(1, &viewport, &scissor);
		setDynamicRasterizationState();
		setDynamicBlendState();
		setDynamicDepthStencilState();
	}